

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

void __thiscall
axl::sl::
ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
::attach(ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
         *this,Hdr *hdr,
        AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
        *p,size_t count)

{
  int32_t *piVar1;
  Hdr *pHVar2;
  FreeFunc *pFVar3;
  
  if (this->m_hdr != hdr) {
    if (hdr != (Hdr *)0x0) {
      LOCK();
      piVar1 = &(hdr->super_BufHdr).super_RefCount.m_refCount;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    pHVar2 = this->m_hdr;
    if (pHVar2 != (Hdr *)0x0) {
      LOCK();
      piVar1 = &(pHVar2->super_BufHdr).super_RefCount.m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(pHVar2->super_BufHdr).super_RefCount._vptr_RefCount)(pHVar2);
        LOCK();
        piVar1 = &(pHVar2->super_BufHdr).super_RefCount.m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (pFVar3 = (pHVar2->super_BufHdr).super_RefCount.m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
          (*pFVar3)(pHVar2);
        }
      }
    }
    this->m_hdr = hdr;
  }
  this->m_p = p;
  this->m_count = count;
  return;
}

Assistant:

void
	attach(
		Hdr* hdr,
		T* p,
		size_t count
	) {
		if (hdr != m_hdr) { // try to avoid unnecessary interlocked ops
			if (hdr)
				hdr->addRef();

			if (m_hdr)
				m_hdr->release();

			m_hdr = hdr;
		}

		m_p = p;
		m_count = count;
	}